

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessVertexArraysTests.cpp
# Opt level: O2

IterateResult __thiscall
gl4cts::DirectStateAccess::VertexArrays::AttributeBindingErrorsTest::iterate
          (AttributeBindingErrorsTest *this)

{
  bool bVar1;
  bool bVar2;
  char cVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  ContextType ctxType;
  deUint32 dVar8;
  undefined4 extraout_var;
  char *description;
  qpTestResult testResult;
  TestContext *this_00;
  GLuint vao;
  GLint max_vertex_attrib_bindings;
  GLint max_vertex_attribs;
  long lVar9;
  
  iVar7 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar9 = CONCAT44(extraout_var,iVar7);
  ctxType.super_ApiType.m_bits =
       (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  bVar1 = glu::contextSupports(ctxType,(ApiType)0x154);
  bVar2 = glu::ContextInfo::isExtensionSupported
                    (((this->super_TestCase).m_context)->m_contextInfo,"GL_ARB_direct_state_access")
  ;
  if ((bVar1) || (bVar2)) {
    max_vertex_attrib_bindings = 0x10;
    max_vertex_attribs = max_vertex_attrib_bindings;
    (**(code **)(lVar9 + 0x410))(1);
    dVar8 = (**(code **)(lVar9 + 0x800))();
    glu::checkError(dVar8,"glCreateVertexArrays call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                    ,0x13cb);
    iVar7 = 0;
    do {
      iVar7 = iVar7 + 1;
      cVar3 = (**(code **)(lVar9 + 0xcd8))(iVar7);
    } while (cVar3 != '\0');
    (**(code **)(lVar9 + 0x868))(0x8869,&max_vertex_attribs);
    (**(code **)(lVar9 + 0x868))(0x82da,&max_vertex_attrib_bindings);
    dVar8 = (**(code **)(lVar9 + 0x800))();
    glu::checkError(dVar8,"glGetIntegerv call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                    ,0x13d4);
    (**(code **)(lVar9 + 0x16a0))(iVar7,0,0);
    bVar1 = CheckError(this,0x502,
                       "INVALID_OPERATION was not generated by VertexArrayAttribBinding if vaobj is not the name of an existing vertex array object."
                      );
    (**(code **)(lVar9 + 0x16a0))(0,max_vertex_attribs,0);
    bVar2 = CheckError(this,0x501,
                       "INVALID_VALUE was not generated by VertexArrayAttribBinding if attribindex is equal to the value of MAX_VERTEX_ATTRIBS."
                      );
    (**(code **)(lVar9 + 0x16a0))(0,max_vertex_attribs + 1,0);
    bVar4 = CheckError(this,0x501,
                       "INVALID_VALUE was not generated by VertexArrayAttribBinding if attribindex is greater than the value of MAX_VERTEX_ATTRIBS."
                      );
    (**(code **)(lVar9 + 0x16a0))(0,0,max_vertex_attrib_bindings);
    bVar5 = CheckError(this,0x501,
                       "INVALID_VALUE was not generated by VertexArrayAttribBinding if bindingindex is equal to the value of MAX_VERTEX_ATTRIB_BINDINGS."
                      );
    (**(code **)(lVar9 + 0x16a0))(0,0,max_vertex_attrib_bindings + 1);
    bVar6 = CheckError(this,0x501,
                       "INVALID_VALUE was not generated by VertexArrayAttribBinding if bindingindex is greater than the value of MAX_VERTEX_ATTRIB_BINDINGS."
                      );
    do {
      iVar7 = (**(code **)(lVar9 + 0x800))();
    } while (iVar7 != 0);
    this_00 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
    if ((((bVar1 && bVar2) && bVar4) && bVar5) && bVar6) {
      description = "Pass";
      testResult = QP_TEST_RESULT_PASS;
    }
    else {
      description = "Fail";
      testResult = QP_TEST_RESULT_FAIL;
    }
  }
  else {
    this_00 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
    description = "Not Supported";
    testResult = QP_TEST_RESULT_NOT_SUPPORTED;
  }
  tcu::TestContext::setTestResult(this_00,testResult,description);
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult AttributeBindingErrorsTest::iterate()
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Get context setup. */
	bool is_at_least_gl_45 = (glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::core(4, 5)));
	bool is_arb_direct_state_access = m_context.getContextInfo().isExtensionSupported("GL_ARB_direct_state_access");

	if ((!is_at_least_gl_45) && (!is_arb_direct_state_access))
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_NOT_SUPPORTED, "Not Supported");

		return STOP;
	}

	/* Running tests. */
	bool is_ok	= true;
	bool is_error = false;

	/* Tested Objects. */
	glw::GLuint vao		  = 0;
	glw::GLuint not_a_vao = 0;

	/* Limits. (Minimum values - OpenGL 4.5 Core Specification, Table 23.55) */
	glw::GLint max_vertex_attribs		  = 16;
	glw::GLint max_vertex_attrib_bindings = 16;

	try
	{
		/* Prepare valid Objects. */
		gl.createVertexArrays(1, &vao);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateVertexArrays call failed.");

		/* Prepare invalid VAO. */
		while (gl.isVertexArray(++not_a_vao))
			;

		/* Prepare limits. */
		gl.getIntegerv(GL_MAX_VERTEX_ATTRIBS, &max_vertex_attribs);
		gl.getIntegerv(GL_MAX_VERTEX_ATTRIB_BINDINGS, &max_vertex_attrib_bindings);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv call failed.");

		/* Not a VAO. */
		gl.vertexArrayAttribBinding(not_a_vao, 0, 0);

		is_ok &= CheckError(GL_INVALID_OPERATION, "INVALID_OPERATION was not generated by VertexArrayAttribBinding if "
												  "vaobj is not the name of an existing vertex array object.");

		/* Too big attribute index. */
		gl.vertexArrayAttribBinding(vao, max_vertex_attribs, 0);

		is_ok &= CheckError(GL_INVALID_VALUE, "INVALID_VALUE was not generated by VertexArrayAttribBinding if "
											  "attribindex is equal to the value of MAX_VERTEX_ATTRIBS.");

		gl.vertexArrayAttribBinding(vao, max_vertex_attribs + 1, 0);

		is_ok &= CheckError(GL_INVALID_VALUE, "INVALID_VALUE was not generated by VertexArrayAttribBinding if "
											  "attribindex is greater than the value of MAX_VERTEX_ATTRIBS.");

		/* Too big binding index. */
		gl.vertexArrayAttribBinding(vao, 0, max_vertex_attrib_bindings);

		is_ok &= CheckError(GL_INVALID_VALUE, "INVALID_VALUE was not generated by VertexArrayAttribBinding if "
											  "bindingindex is equal to the value of MAX_VERTEX_ATTRIB_BINDINGS.");

		gl.vertexArrayAttribBinding(vao, 0, max_vertex_attrib_bindings + 1);

		is_ok &= CheckError(GL_INVALID_VALUE, "INVALID_VALUE was not generated by VertexArrayAttribBinding if "
											  "bindingindex is greater than the value of MAX_VERTEX_ATTRIB_BINDINGS.");
	}
	catch (...)
	{
		is_ok	= false;
		is_error = true;
	}

	/* Clean up. */
	if (vao)
	{
		gl.deleteVertexArrays(1, &vao);
	}

	/* Errors clean up. */
	while (gl.getError())
		;

	/* Result's setup. */
	if (is_ok)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		if (is_error)
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_INTERNAL_ERROR, "Error");
		}
		else
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
		}
	}

	return STOP;
}